

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeView.cc
# Opt level: O0

vector<unsigned_short,_std::allocator<unsigned_short>_> * __thiscall
NodeView::kmer_coverage(NodeView *this,int kcovds_idx,int kcovds_count_idx)

{
  int in_ECX;
  long in_RSI;
  NodeView *in_RDI;
  string *in_stack_000009a8;
  uint16_t in_stack_000009b6;
  KmerCounter *in_stack_000009b8;
  string local_38 [56];
  
  std::vector<KmerCounter,_std::allocator<KmerCounter>_>::operator[]
            ((vector<KmerCounter,_std::allocator<KmerCounter>_> *)
             (*(long *)(**(long **)(in_RSI + 8) + 0xe8) + 0x138),(long)in_ECX);
  sequence_abi_cxx11_(in_RDI);
  KmerCounter::project_count(in_stack_000009b8,in_stack_000009b6,in_stack_000009a8);
  std::__cxx11::string::~string(local_38);
  return (vector<unsigned_short,_std::allocator<unsigned_short>_> *)in_RDI;
}

Assistant:

std::vector<uint16_t> NodeView::kmer_coverage(int kcovds_idx, int kcovds_count_idx) const {
    return dg->sdg.ws.kmer_counters[kcovds_count_idx].project_count(kcovds_count_idx,sequence());
}